

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deadlock_test.cpp
# Opt level: O3

void __thiscall
CheckedMutexTest_SimultaneousDeadlock_Test<yamc::checked::basic_shared_mutex<yamc::rwlock::ReaderPrefer>_>
::TestBody(CheckedMutexTest_SimultaneousDeadlock_Test<yamc::checked::basic_shared_mutex<yamc::rwlock::ReaderPrefer>_>
           *this)

{
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var2;
  bool bVar3;
  int iVar4;
  char *message;
  long lVar5;
  StringLike<const_char_*> *regex;
  DeathTest *gtest_dt;
  anon_class_1_0_00000001 test_body;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  anon_class_1_0_00000001 local_69;
  AssertHelper local_68;
  Message local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_40;
  
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_68.data_ = (AssertHelperData *)0x1dc044;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_60,
               (testing *)&local_68,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_40,(PolymorphicMatcher *)&local_60);
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("test_body()",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_40,
                       "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/deadlock_test.cpp"
                       ,0xb3,(DeathTest **)&local_78);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_40);
    _Var1._M_head_impl = local_78._M_head_impl;
    if (bVar3) {
      if (local_78._M_head_impl ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        return;
      }
      iVar4 = (**(code **)(*(long *)local_78._M_head_impl + 0x10))(local_78._M_head_impl);
      _Var2._M_head_impl = local_78._M_head_impl;
      if (iVar4 == 0) {
        testing::KilledBySignal::KilledBySignal((KilledBySignal *)&local_60,6);
        iVar4 = (**(code **)(*(long *)local_78._M_head_impl + 0x18))();
        bVar3 = testing::KilledBySignal::operator()((KilledBySignal *)&local_60,iVar4);
        iVar4 = (**(code **)(*(long *)_Var2._M_head_impl + 0x20))(_Var2._M_head_impl,(ulong)bVar3);
        if ((char)iVar4 == '\0') {
          (**(code **)(*(long *)_Var1._M_head_impl + 8))(_Var1._M_head_impl);
          goto LAB_0018dc32;
        }
      }
      else if (iVar4 == 1) {
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          TestBody::anon_class_1_0_00000001::operator()(&local_69);
        }
        (**(code **)(*(long *)local_78._M_head_impl + 0x28))(local_78._M_head_impl,2);
        (**(code **)(*(long *)_Var2._M_head_impl + 0x28))(_Var2._M_head_impl,0);
      }
      lVar5 = *(long *)_Var1._M_head_impl;
      local_60.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )_Var1._M_head_impl;
      goto LAB_0018dc85;
    }
  }
LAB_0018dc32:
  testing::Message::Message(&local_60);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_68,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/deadlock_test.cpp"
             ,0xb3,message);
  testing::internal::AssertHelper::operator=(&local_68,&local_60);
  testing::internal::AssertHelper::~AssertHelper(&local_68);
  if (local_60.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl ==
      (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )0x0) {
    return;
  }
  lVar5 = *(long *)local_60.ss_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl;
LAB_0018dc85:
  (**(code **)(lVar5 + 8))
            (local_60.ss_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl);
  return;
}

Assistant:

TYPED_TEST(CheckedMutexTest, SimultaneousDeadlock)
{
  auto test_body = []{
    constexpr size_t NPAIRS = 4;
    yamc::test::barrier step(NPAIRS * 2);
    TypeParam mtx[NPAIRS * 2];
    yamc::test::task_runner(NPAIRS * 2, [&](std::size_t id) {
      TypeParam& mtx1 = mtx[id % NPAIRS];
      TypeParam& mtx2 = mtx[id % NPAIRS + NPAIRS];
      if (id < NPAIRS) {
        ASSERT_NO_THROW(mtx1.lock());
        step.await();
        EXPECT_NO_THROW(mtx2.lock());
        EXPECT_NO_THROW(mtx2.unlock());
        EXPECT_NO_THROW(mtx1.unlock());
      } else {
        ASSERT_NO_THROW(mtx2.lock());
        step.await();
        WAIT_TICKS;
        EXPECT_CHECK_FAILURE_INNER({
          mtx1.lock();
        });
        EXPECT_NO_THROW(mtx2.unlock());
      }
    });
  };
  EXPECT_CHECK_FAILURE_OUTER(test_body());
}